

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,int other)

{
  RangeValue RVar1;
  RangeValue RVar2;
  undefined1 local_38 [8];
  RangeValue retval;
  int other_local;
  RangeValue *this_local;
  size_t local_10;
  
  retval._val._4_4_ = other;
  RangeValue((RangeValue *)local_38);
  if ((this->_isUnbound & 1U) == 0) {
    if (retval._val._4_4_ < 0) {
      RVar1 = operator+(this,(long)-retval._val._4_4_);
      this_local._0_1_ = RVar1._isUnbound;
    }
    else {
      RVar1 = operator-(this,(long)retval._val._4_4_);
      this_local._0_1_ = RVar1._isUnbound;
    }
  }
  else {
    this_local._0_1_ = local_38[0];
    RVar1._val = retval._0_8_;
    RVar1._isUnbound = retval._isUnbound;
    RVar1._1_7_ = retval._1_7_;
  }
  local_10 = RVar1._val;
  RVar2._1_7_ = RVar1._1_7_;
  RVar2._isUnbound = (bool)this_local._0_1_;
  RVar2._val = local_10;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator- (int other) const {
    RangeValue retval;
    if (_isUnbound)
        return retval;
    else if (other < 0) {
        return (*this) + static_cast<size_t>(-1*other);
    }
    else
        return (*this) - static_cast<size_t>(other);
}